

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

LockResult util::LockDirectory(path *directory,path *lockfile_name,bool probe_only)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  size_type sVar3;
  FILE *__stream;
  Logger *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  LockResult LVar5;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  __single_object lock;
  UniqueLock<GlobalMutex> criticalblock0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  path local_120;
  path pathLockFile;
  string local_70;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37;
  UniqueLock<GlobalMutex>::UniqueLock
            (&criticalblock0,&cs_dir_locks,"cs_dir_locks",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs_helpers.cpp"
             ,0x37,false);
  std::filesystem::__cxx11::path::path(&local_120,&directory->super_path);
  fs::operator/(&pathLockFile,(path *)&local_120,lockfile_name);
  std::filesystem::__cxx11::path::~path(&local_120);
  std::filesystem::__cxx11::path::string(&log_msg,&pathLockFile.super_path);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>_>_>_>
          ::count(&dir_locks_abi_cxx11_,&log_msg);
  std::__cxx11::string::~string((string *)&log_msg);
  LVar5 = Success;
  if (sVar3 == 0) {
    __stream = fsbridge::fopen((char *)&pathLockFile,"a");
    if (__stream == (FILE *)0x0) {
      LVar5 = ErrorWrite;
    }
    else {
      fclose(__stream);
      std::make_unique<fsbridge::FileLock,fs::path&>((path *)&lock);
      bVar2 = fsbridge::FileLock::TryLock
                        ((FileLock *)
                         lock._M_t.
                         super___uniq_ptr_impl<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_fsbridge::FileLock_*,_std::default_delete<fsbridge::FileLock>_>
                         .super__Head_base<0UL,_fsbridge::FileLock_*,_false>._M_head_impl);
      if (bVar2) {
        LVar5 = Success;
        if (!probe_only) {
          std::filesystem::__cxx11::path::string(&log_msg,&pathLockFile.super_path);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>>
          ::
          _M_emplace_unique<std::__cxx11::string,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<fsbridge::FileLock,std::default_delete<fsbridge::FileLock>>>>>
                      *)&dir_locks_abi_cxx11_,&log_msg,&lock);
          std::__cxx11::string::~string((string *)&log_msg);
        }
      }
      else {
        std::filesystem::__cxx11::path::string(&local_140,&directory->super_path);
        std::__cxx11::string::string
                  ((string *)&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   lock._M_t.
                   super___uniq_ptr_impl<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_fsbridge::FileLock_*,_std::default_delete<fsbridge::FileLock>_>
                   .super__Head_base<0UL,_fsbridge::FileLock_*,_false>._M_head_impl);
        pLVar4 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar4);
        if (bVar2) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_70,(tinyformat *)"Error while attempting to lock directory %s: %s\n",
                     (char *)&local_140,&local_160,args_1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          pLVar4 = LogInstance();
          local_70._M_dataplus._M_p = (pointer)0x5c;
          local_70._M_string_length = 0x42ed49;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs_helpers.cpp"
          ;
          source_file._M_len = 0x5c;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function._M_str = "LockDirectory";
          logging_function._M_len = 0xd;
          BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x47,ALL,Error);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_140);
        LVar5 = ErrorLock;
      }
      std::unique_ptr<fsbridge::FileLock,_std::default_delete<fsbridge::FileLock>_>::~unique_ptr
                (&lock);
    }
  }
  std::filesystem::__cxx11::path::~path(&pathLockFile.super_path);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return LVar5;
  }
  __stack_chk_fail();
}

Assistant:

LockResult LockDirectory(const fs::path& directory, const fs::path& lockfile_name, bool probe_only)
{
    LOCK(cs_dir_locks);
    fs::path pathLockFile = directory / lockfile_name;

    // If a lock for this directory already exists in the map, don't try to re-lock it
    if (dir_locks.count(fs::PathToString(pathLockFile))) {
        return LockResult::Success;
    }

    // Create empty lock file if it doesn't exist.
    if (auto created{fsbridge::fopen(pathLockFile, "a")}) {
        std::fclose(created);
    } else {
        return LockResult::ErrorWrite;
    }
    auto lock = std::make_unique<fsbridge::FileLock>(pathLockFile);
    if (!lock->TryLock()) {
        LogError("Error while attempting to lock directory %s: %s\n", fs::PathToString(directory), lock->GetReason());
        return LockResult::ErrorLock;
    }
    if (!probe_only) {
        // Lock successful and we're not just probing, put it into the map
        dir_locks.emplace(fs::PathToString(pathLockFile), std::move(lock));
    }
    return LockResult::Success;
}